

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

int lyht_insert_with_resize_cb
              (hash_table *ht,void *val_p,uint32_t hash,values_equal_cb resize_val_equal,
              void **match_p)

{
  ht_rec *first;
  int iVar1;
  uint uVar2;
  values_equal_cb local_60;
  values_equal_cb old_val_equal;
  int ret;
  int r;
  int32_t i;
  ht_rec *crec;
  ht_rec *rec;
  void **match_p_local;
  values_equal_cb resize_val_equal_local;
  void *pvStack_20;
  uint32_t hash_local;
  void *val_p_local;
  hash_table *ht_local;
  
  _r = (ht_rec *)0x0;
  rec = (ht_rec *)match_p;
  match_p_local = (void **)resize_val_equal;
  resize_val_equal_local._4_4_ = hash;
  pvStack_20 = val_p;
  val_p_local = ht;
  iVar1 = lyht_find_first(ht,hash,&crec);
  if (iVar1 == 0) {
    if ((crec->hash == resize_val_equal_local._4_4_) &&
       (iVar1 = (**(code **)((long)val_p_local + 8))
                          (pvStack_20,crec->val,1,*(undefined8 *)((long)val_p_local + 0x10)),
       iVar1 != 0)) {
      if (rec != (ht_rec *)0x0) {
        *(uchar **)rec = crec->val;
      }
      return 1;
    }
    first = crec;
    _r = crec;
    for (ret = 1; ret < first->hits; ret = ret + 1) {
      iVar1 = lyht_find_collision((hash_table *)val_p_local,&crec,first);
      if (iVar1 != 0) {
        __assert_fail("!r",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                      ,0x272,
                      "int lyht_insert_with_resize_cb(struct hash_table *, void *, uint32_t, values_equal_cb, void **)"
                     );
      }
      if ((crec->hash == resize_val_equal_local._4_4_) &&
         (iVar1 = (**(code **)((long)val_p_local + 8))
                            (pvStack_20,crec->val,1,*(undefined8 *)((long)val_p_local + 0x10)),
         iVar1 != 0)) {
        if (rec != (ht_rec *)0x0) {
          *(uchar **)rec = crec->val;
        }
        return 1;
      }
    }
    iVar1 = lyht_find_collision((hash_table *)val_p_local,&crec,first);
    if (iVar1 == 0) {
      __assert_fail("r",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                    ,0x27f,
                    "int lyht_insert_with_resize_cb(struct hash_table *, void *, uint32_t, values_equal_cb, void **)"
                   );
    }
  }
  if (crec->hits < 1) {
    crec->hash = resize_val_equal_local._4_4_;
    crec->hits = 1;
    memcpy(crec->val,pvStack_20,(ulong)*(ushort *)((long)val_p_local + 0x1a) - 8);
    if (rec != (ht_rec *)0x0) {
      *(uchar **)rec = crec->val;
    }
    if (_r != (ht_rec *)0x0) {
      if (_r->hits == 0x7fffffff) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
               ,0x28e);
      }
      _r->hits = _r->hits + 1;
    }
    old_val_equal._4_4_ = 0;
    *(int *)val_p_local = *val_p_local + 1;
    if (*(short *)((long)val_p_local + 0x18) != 0) {
      uVar2 = (uint)(*val_p_local * 100) / *(uint *)((long)val_p_local + 4);
      if ((*(short *)((long)val_p_local + 0x18) == 1) && (0x31 < (int)uVar2)) {
        *(undefined2 *)((long)val_p_local + 0x18) = 2;
      }
      if ((*(short *)((long)val_p_local + 0x18) == 2) && (0x4a < (int)uVar2)) {
        if (match_p_local != (void **)0x0) {
          local_60 = lyht_set_cb((hash_table *)val_p_local,(values_equal_cb)match_p_local);
        }
        old_val_equal._4_4_ = lyht_resize((hash_table *)val_p_local,1);
        if ((old_val_equal._4_4_ == 0) && (rec != (ht_rec *)0x0)) {
          lyht_find((hash_table *)val_p_local,pvStack_20,resize_val_equal_local._4_4_,(void **)rec);
        }
        if (match_p_local != (void **)0x0) {
          lyht_set_cb((hash_table *)val_p_local,local_60);
        }
      }
    }
    return old_val_equal._4_4_;
  }
  __assert_fail("rec->hits < 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                ,0x283,
                "int lyht_insert_with_resize_cb(struct hash_table *, void *, uint32_t, values_equal_cb, void **)"
               );
}

Assistant:

int
lyht_insert_with_resize_cb(struct hash_table *ht, void *val_p, uint32_t hash,
                           values_equal_cb resize_val_equal, void **match_p)
{
    struct ht_rec *rec, *crec = NULL;
    int32_t i;
    int r, ret;
    values_equal_cb old_val_equal;

    if (!lyht_find_first(ht, hash, &rec)) {
        /* we found matching shortened hash */
        if ((rec->hash == hash) && ht->val_equal(val_p, &rec->val, 1, ht->cb_data)) {
            /* even the value matches */
            if (match_p) {
                *match_p = (void *)&rec->val;
            }
            return 1;
        }

        /* some collisions, we need to go through them, too */
        crec = rec;
        for (i = 1; i < crec->hits; ++i) {
            r = lyht_find_collision(ht, &rec, crec);
            assert(!r);

            /* compare values */
            if ((rec->hash == hash) && ht->val_equal(val_p, &rec->val, 1, ht->cb_data)) {
                if (match_p) {
                    *match_p = (void *)&rec->val;
                }
                return 1;
            }
        }

        /* value not found, get the record where it will be inserted */
        r = lyht_find_collision(ht, &rec, crec);
        assert(r);
    }

    /* insert it into the returned record */
    assert(rec->hits < 1);
    rec->hash = hash;
    rec->hits = 1;
    memcpy(&rec->val, val_p, ht->rec_size - (sizeof(struct ht_rec) - 1));
    if (match_p) {
        *match_p = (void *)&rec->val;
    }

    if (crec) {
        /* there was a collision, increase hits */
        if (crec->hits == INT32_MAX) {
            LOGINT(NULL);
        }
        ++crec->hits;
    }

    /* check size & enlarge if needed */
    ret = 0;
    ++ht->used;
    if (ht->resize) {
        r = (ht->used * 100) / ht->size;
        if ((ht->resize == 1) && (r >= LYHT_FIRST_SHRINK_PERCENTAGE)) {
            /* enable shrinking */
            ht->resize = 2;
        }
        if ((ht->resize == 2) && (r >= LYHT_ENLARGE_PERCENTAGE)) {
            if (resize_val_equal) {
                old_val_equal = lyht_set_cb(ht, resize_val_equal);
            }

            /* enlarge */
            ret = lyht_resize(ht, 1);
            /* if hash_table was resized, we need to find new matching value */
            if (ret == 0 && match_p) {
                lyht_find(ht, val_p, hash, match_p);
            }

            if (resize_val_equal) {
                lyht_set_cb(ht, old_val_equal);
            }
        }
    }
    return ret;
}